

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

bool __thiscall just::test::test_case::run(test_case *this,ostream *report_)

{
  ostream *poVar1;
  assertion_failed *e_;
  exception *e__1;
  ostream *report__local;
  test_case *this_local;
  
  poVar1 = std::operator<<(report_,"Running ");
  poVar1 = std::operator<<(poVar1,(string *)&this->_name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  (*this->_f)();
  return true;
}

Assistant:

bool run(std::ostream& report_) const
      {
        report_ << "Running " << _name << std::endl;
        try
        {
          _f();
          return true;
        }
        catch (const assertion_failed& e_)
        {
          report_
            << "  Assertion failed" << std::endl
            << "    " << e_.msg() << std::endl
            << "    Test case: " << _name << std::endl
            << "    Location: " << e_.filename() << ":" << e_.line() <<std::endl
            ;
        }
        catch (const std::exception& e_)
        {
          report_
            << "  std::exception thrown" << std::endl
            << "    what: " << e_.what() << std::endl
            << "    Test case: " << _name << std::endl;
        }
        catch (...)
        {
          report_
            << "  Exception thrown" << std::endl
            << "    Test case: " << _name << std::endl;
        }
        return false;
      }